

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTableImpl(UntypedMapBase *this,bool reset)

{
  byte bVar1;
  uint uVar2;
  NodeBase **ppNVar3;
  NodeBase *pNVar4;
  Nullable<const_char_*> failure_msg;
  long lVar5;
  NodeBase *pNVar6;
  ulong uVar7;
  LogMessageFatal local_48;
  map_index_t local_34;
  
  local_34 = this->num_buckets_;
  local_48.super_LogMessage._0_8_ = (UntypedMapBase *)0x1;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_long>
                          (&local_34,(unsigned_long *)&local_48,
                           "num_buckets_ != kGlobalEmptyTableSize");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
               ,0x76,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
  }
  if (this->arena_ == (Arena *)0x0) {
    bVar1 = (this->type_info_).field_0x3;
    if (bVar1 < 0x50) {
      if ((bVar1 & 0xf) < 5) {
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
      else {
        if ((bVar1 & 0xf) != 5) goto LAB_00207eb3;
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            std::__cxx11::string::~string((string *)(pNVar6 + 1));
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
    }
    else if (bVar1 >> 4 == 6) {
      if ((bVar1 & 0xf) < 5) {
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        local_48.super_LogMessage._0_8_ = this;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            ClearTableImpl::anon_class_16_2_3fe2b05f::
            operator()<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:155:20)>
            ::anon_class_8_1_769aec9c::anon_class_8_1_8991fb9c_for_value_handler::operator()
                      ((anon_class_8_1_8991fb9c_for_value_handler *)&local_48,pNVar6);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
      else {
        if ((bVar1 & 0xf) != 5) goto LAB_00207eb3;
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        local_48.super_LogMessage._0_8_ = this;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            std::__cxx11::string::~string((string *)(pNVar6 + 1));
            ClearTableImpl::anon_class_16_2_3fe2b05f::
            operator()<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:155:20)>
            ::anon_class_8_1_769aec9c::anon_class_8_1_8991fb9c_for_value_handler::operator()
                      ((anon_class_8_1_8991fb9c_for_value_handler *)&local_48,pNVar6);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
    }
    else {
      if (bVar1 >> 4 != 5) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
                    ,0x9f);
      }
      if ((bVar1 & 0xf) < 5) {
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        local_48.super_LogMessage._0_8_ = this;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            ClearTableImpl::anon_class_16_2_3fe2b05f::
            operator()<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:151:20)>
            ::anon_class_8_1_769aec9c::anon_class_8_1_8991fb9c_for_value_handler::operator()
                      ((anon_class_8_1_8991fb9c_for_value_handler *)&local_48,pNVar6);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
      else {
        if ((bVar1 & 0xf) != 5) {
LAB_00207eb3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
                      ,0x90);
        }
        ppNVar3 = this->table_;
        uVar2 = this->num_buckets_;
        local_48.super_LogMessage._0_8_ = this;
        for (uVar7 = (ulong)this->index_of_first_non_null_; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          pNVar6 = ppNVar3[uVar7];
          while (pNVar6 != (NodeBase *)0x0) {
            pNVar4 = pNVar6->next;
            std::__cxx11::string::~string((string *)(pNVar6 + 1));
            ClearTableImpl::anon_class_16_2_3fe2b05f::
            operator()<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc:151:20)>
            ::anon_class_8_1_769aec9c::anon_class_8_1_8991fb9c_for_value_handler::operator()
                      ((anon_class_8_1_8991fb9c_for_value_handler *)&local_48,pNVar6);
            operator_delete(pNVar6,(ulong)(this->type_info_).node_size);
            pNVar6 = pNVar4;
          }
        }
      }
    }
  }
  ppNVar3 = this->table_;
  uVar2 = this->num_buckets_;
  if (reset) {
    for (lVar5 = 0; (ulong)uVar2 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
      *(undefined8 *)((long)ppNVar3 + lVar5) = 0;
    }
    this->num_elements_ = 0;
    this->index_of_first_non_null_ = uVar2;
  }
  else {
    DeleteTable(this,ppNVar3,uVar2);
  }
  return;
}

Assistant:

void UntypedMapBase::ClearTableImpl(bool reset) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (arena_ == nullptr) {
    const auto loop = [this](auto destroy_node) {
      NodeBase** table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        for (NodeBase* node = table[b]; node != nullptr;) {
          NodeBase* next = node->next;
          absl::PrefetchToLocalCacheNta(next);
          destroy_node(node);
          SizedDelete(node, type_info_.node_size);
          node = next;
        }
      }
    };

    const auto dispatch_key = [&](auto value_handler) {
      if (type_info_.key_type_kind() < TypeKind::kString) {
        loop(value_handler);
      } else if (type_info_.key_type_kind() == TypeKind::kString) {
        loop([=](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          value_handler(node);
        });
      } else {
        Unreachable();
      }
    };

    if (type_info_.value_type_kind() < TypeKind::kString) {
      dispatch_key([](NodeBase*) {});
    } else if (type_info_.value_type_kind() == TypeKind::kString) {
      dispatch_key([&](NodeBase* node) {
        GetValue<std::string>(node)->~basic_string();
      });
    } else if (type_info_.value_type_kind() == TypeKind::kMessage) {
      dispatch_key([&](NodeBase* node) {
        GetValue<MessageLite>(node)->DestroyInstance();
      });
    } else {
      Unreachable();
    }
  }

  if (reset) {
    std::fill(table_, table_ + num_buckets_, nullptr);
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}